

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall rlottie::internal::renderer::CompLayer::updateContent(CompLayer *this)

{
  Clipper *this_00;
  pointer ppLVar1;
  uint uVar2;
  Layer **layer;
  pointer ppLVar3;
  float fVar4;
  VMatrix local_58;
  
  this_00 = (this->mClipper)._M_t.
            super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            ._M_t.
            super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl;
  if ((this_00 != (Clipper *)0x0) && (((this->super_Layer).mDirtyFlag.i & 1) != 0)) {
    local_58.m33 = (this->super_Layer).mCombinedMatrix.m33;
    local_58.mType = (this->super_Layer).mCombinedMatrix.mType;
    local_58.dirty = (this->super_Layer).mCombinedMatrix.dirty;
    local_58._38_2_ = *(undefined2 *)&(this->super_Layer).mCombinedMatrix.field_0x26;
    local_58.m11 = (this->super_Layer).mCombinedMatrix.m11;
    local_58.m12 = (this->super_Layer).mCombinedMatrix.m12;
    local_58.m13 = (this->super_Layer).mCombinedMatrix.m13;
    local_58.m21 = (this->super_Layer).mCombinedMatrix.m21;
    local_58.m22 = (this->super_Layer).mCombinedMatrix.m22;
    local_58.m23 = (this->super_Layer).mCombinedMatrix.m23;
    local_58.mtx = (this->super_Layer).mCombinedMatrix.mtx;
    local_58.mty = (this->super_Layer).mCombinedMatrix.mty;
    Clipper::update(this_00,&local_58);
  }
  uVar2 = model::Layer::timeRemap((this->super_Layer).mLayerData,(this->super_Layer).mFrameNo);
  if ((this->super_Layer).mComplexContent == false) {
    fVar4 = (this->super_Layer).mCombinedAlpha;
  }
  else {
    fVar4 = 1.0;
  }
  ppLVar1 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar3 = (this->mLayers).
                 super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppLVar3 != ppLVar1;
      ppLVar3 = ppLVar3 + 1) {
    local_58.m33 = (this->super_Layer).mCombinedMatrix.m33;
    local_58.mType = (this->super_Layer).mCombinedMatrix.mType;
    local_58.dirty = (this->super_Layer).mCombinedMatrix.dirty;
    local_58._38_2_ = *(undefined2 *)&(this->super_Layer).mCombinedMatrix.field_0x26;
    local_58.m11 = (this->super_Layer).mCombinedMatrix.m11;
    local_58.m12 = (this->super_Layer).mCombinedMatrix.m12;
    local_58.m13 = (this->super_Layer).mCombinedMatrix.m13;
    local_58.m21 = (this->super_Layer).mCombinedMatrix.m21;
    local_58.m22 = (this->super_Layer).mCombinedMatrix.m22;
    local_58.m23 = (this->super_Layer).mCombinedMatrix.m23;
    local_58.mtx = (this->super_Layer).mCombinedMatrix.mtx;
    local_58.mty = (this->super_Layer).mCombinedMatrix.mty;
    (*(*ppLVar3)->_vptr_Layer[2])(fVar4,*ppLVar3,(ulong)uVar2,&local_58);
  }
  return;
}

Assistant:

void renderer::CompLayer::updateContent()
{
    if (mClipper && flag().testFlag(DirtyFlagBit::Matrix)) {
        mClipper->update(combinedMatrix());
    }
    int   mappedFrame = mLayerData->timeRemap(frameNo());
    float alpha = combinedAlpha();
    if (complexContent()) alpha = 1;
    for (const auto &layer : mLayers) {
        layer->update(mappedFrame, combinedMatrix(), alpha);
    }
}